

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdApi.c
# Opt level: O0

int Cmd_CommandHandleSpecial(Abc_Frame_t *pAbc,char *sCommand)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  char *pcVar2;
  char *pcVar3;
  uint local_a8;
  bool local_a1;
  double local_a0;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  double local_88;
  uint local_7c;
  uint local_78;
  uint local_74;
  double Eplison;
  char *pNumb;
  int Status;
  int proofStatus;
  int Depth;
  int DepthNew;
  double Area;
  double AreaNew;
  int ndCount;
  int ndCountNew;
  int poCount;
  int poCountNew;
  int piCount;
  int piCountNew;
  Abc_Ntk_t *pNtk;
  char *sCommand_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  if ((pNtk_00 == (Abc_Ntk_t *)0x0) || (iVar1 = Abc_NtkHasMapping(pNtk_00), iVar1 == 0)) {
    local_74 = 0;
  }
  else {
    local_74 = Abc_NtkCiNum(pNtk_00);
  }
  if ((pNtk_00 == (Abc_Ntk_t *)0x0) || (iVar1 = Abc_NtkHasMapping(pNtk_00), iVar1 == 0)) {
    local_78 = 0;
  }
  else {
    local_78 = Abc_NtkCoNum(pNtk_00);
  }
  if ((pNtk_00 == (Abc_Ntk_t *)0x0) || (iVar1 = Abc_NtkHasMapping(pNtk_00), iVar1 == 0)) {
    local_7c = 0;
  }
  else {
    local_7c = Abc_NtkNodeNum(pNtk_00);
  }
  if ((pNtk_00 == (Abc_Ntk_t *)0x0) || (iVar1 = Abc_NtkHasMapping(pNtk_00), iVar1 == 0)) {
    local_88 = 0.0;
  }
  else {
    local_88 = Abc_NtkGetMappedArea(pNtk_00);
  }
  if ((pNtk_00 == (Abc_Ntk_t *)0x0) || (iVar1 = Abc_NtkHasMapping(pNtk_00), iVar1 == 0)) {
    local_8c = 0;
  }
  else {
    local_8c = Abc_NtkLevel(pNtk_00);
  }
  pcVar2 = strstr(sCommand,"#PS");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strstr(sCommand,"#CEC");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = strstr(sCommand,"#ASSERT");
      if (pcVar2 == (char *)0x0) {
        pAbc_local._4_4_ = 0;
      }
      else {
        pcVar2 = strrchr(sCommand,0x3d);
        pcVar3 = strstr(sCommand,"_PI_");
        if (pcVar3 == (char *)0x0) {
          pcVar3 = strstr(sCommand,"_PO_");
          if (pcVar3 == (char *)0x0) {
            pcVar3 = strstr(sCommand,"_NODE_");
            if (pcVar3 == (char *)0x0) {
              pcVar3 = strstr(sCommand,"_AREA_");
              if (pcVar3 == (char *)0x0) {
                pcVar3 = strstr(sCommand,"_DEPTH_");
                if (pcVar3 == (char *)0x0) {
                  return 0;
                }
                if (pcVar2 == (char *)0x0) {
                  local_a8 = 0;
                }
                else {
                  local_a8 = atoi(pcVar2 + 1);
                }
                pcVar2 = strstr(sCommand,"==");
                if (pcVar2 == (char *)0x0) {
                  pcVar2 = strstr(sCommand,"<=");
                  if (pcVar2 == (char *)0x0) {
                    return 0;
                  }
                  local_a1 = (int)local_8c <= (int)local_a8;
                }
                else {
                  local_a1 = local_8c == local_a8;
                }
              }
              else {
                if (pcVar2 == (char *)0x0) {
                  local_a0 = 0.0;
                }
                else {
                  local_a0 = atof(pcVar2 + 1);
                }
                pcVar2 = strstr(sCommand,"==");
                if (pcVar2 == (char *)0x0) {
                  pcVar2 = strstr(sCommand,"<=");
                  if (pcVar2 == (char *)0x0) {
                    return 0;
                  }
                  local_a1 = local_88 <= local_a0 + 1.0;
                }
                else {
                  local_a1 = local_a0 - 1.0 <= local_88 && local_88 <= local_a0 + 1.0;
                }
              }
            }
            else {
              if (pcVar2 == (char *)0x0) {
                local_98 = 0;
              }
              else {
                local_98 = atoi(pcVar2 + 1);
              }
              pcVar2 = strstr(sCommand,"==");
              if (pcVar2 == (char *)0x0) {
                pcVar2 = strstr(sCommand,"<=");
                if (pcVar2 == (char *)0x0) {
                  return 0;
                }
                local_a1 = (int)local_7c <= (int)local_98;
              }
              else {
                local_a1 = local_7c == local_98;
              }
            }
          }
          else {
            if (pcVar2 == (char *)0x0) {
              local_94 = 0;
            }
            else {
              local_94 = atoi(pcVar2 + 1);
            }
            pcVar2 = strstr(sCommand,"==");
            if (pcVar2 == (char *)0x0) {
              pcVar2 = strstr(sCommand,"<=");
              if (pcVar2 == (char *)0x0) {
                return 0;
              }
              local_a1 = (int)local_78 <= (int)local_94;
            }
            else {
              local_a1 = local_78 == local_94;
            }
          }
        }
        else {
          if (pcVar2 == (char *)0x0) {
            local_90 = 0;
          }
          else {
            local_90 = atoi(pcVar2 + 1);
          }
          pcVar2 = strstr(sCommand,"==");
          if (pcVar2 == (char *)0x0) {
            pcVar2 = strstr(sCommand,"<=");
            if (pcVar2 == (char *)0x0) {
              return 0;
            }
            local_a1 = (int)local_74 <= (int)local_90;
          }
          else {
            local_a1 = local_74 == local_90;
          }
        }
        pcVar2 = "failed";
        if (local_a1) {
          pcVar2 = "succeeded";
        }
        printf("%s\n",pcVar2);
        pAbc_local._4_4_ = 1;
      }
    }
    else {
      printf("proofStatus=%d\n",1);
      pAbc_local._4_4_ = 1;
    }
  }
  else {
    printf("pi=%d ",(ulong)local_74);
    printf("po=%d ",(ulong)local_78);
    printf("fn=%d ",(ulong)local_7c);
    printf("ma=%.1f ",local_88);
    printf("de=%d ",(ulong)local_8c);
    printf("\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Cmd_CommandHandleSpecial( Abc_Frame_t * pAbc, const char * sCommand )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int piCountNew = (pNtk && Abc_NtkHasMapping(pNtk)) ? Abc_NtkCiNum(pNtk)         : 0, piCount = 0;
    int poCountNew = (pNtk && Abc_NtkHasMapping(pNtk)) ? Abc_NtkCoNum(pNtk)         : 0, poCount = 0;
    int ndCountNew = (pNtk && Abc_NtkHasMapping(pNtk)) ? Abc_NtkNodeNum(pNtk)       : 0, ndCount = 0;
    double AreaNew = (pNtk && Abc_NtkHasMapping(pNtk)) ? Abc_NtkGetMappedArea(pNtk) : 0, Area    = 0;
    int DepthNew   = (pNtk && Abc_NtkHasMapping(pNtk)) ? Abc_NtkLevel(pNtk)         : 0, Depth   = 0;
    if ( strstr(sCommand, "#PS") ) 
    {
        printf( "pi=%d ",   piCountNew );
        printf( "po=%d ",   poCountNew );
        printf( "fn=%d ",   ndCountNew );
        printf( "ma=%.1f ", AreaNew    );
        printf( "de=%d ",   DepthNew   );
        printf( "\n" );
        return 1;
    }
    if ( strstr(sCommand, "#CEC") ) 
    {
        //int proofStatus = Abc_NtkVerifyUsingCec(pNtk);
        int proofStatus = 1;
        // -1 (undecided), 0 (different), 1 (equivalent)
        printf( "proofStatus=%d\n", proofStatus );
        return 1;
    }
    if ( strstr(sCommand, "#ASSERT") ) 
    {
        int Status    = 0;
        char * pNumb  = strrchr( (char *)sCommand, '=' );
        if ( strstr(sCommand, "_PI_") ) 
        {
            piCount = pNumb ? atoi(pNumb+1) : 0;
            if ( strstr( sCommand, "==" ) )
                Status = piCountNew == piCount;
            else if ( strstr( sCommand, "<=" ) )
                Status = piCountNew <= piCount;
            else return 0;
        }
        else if ( strstr(sCommand, "_PO_") ) 
        {
            poCount = pNumb ? atoi(pNumb+1) : 0;
            if ( strstr( sCommand, "==" ) )
                Status = poCountNew == poCount;
            else if ( strstr( sCommand, "<=" ) )
                Status = poCountNew <= poCount;
            else return 0;
        }
        else if ( strstr(sCommand, "_NODE_") ) 
        {
            ndCount = pNumb ? atoi(pNumb+1) : 0;
            if ( strstr( sCommand, "==" ) )
                Status = ndCountNew == ndCount;
            else if ( strstr( sCommand, "<=" ) )
                Status = ndCountNew <= ndCount;
            else return 0;
        }
        else if ( strstr(sCommand, "_AREA_") ) 
        {
            double Eplison = 1.0;
            Area = pNumb ? atof(pNumb+1) : 0;
            if ( strstr( sCommand, "==" ) )
                Status = AreaNew >= Area - Eplison && AreaNew <= Area + Eplison;
            else if ( strstr( sCommand, "<=" ) )
                Status = AreaNew <= Area + Eplison;
            else return 0;
        }
        else if ( strstr(sCommand, "_DEPTH_") ) 
        {
            Depth = pNumb ? atoi(pNumb+1) : 0;
            if ( strstr( sCommand, "==" ) )
                Status = DepthNew == Depth;
            else if ( strstr( sCommand, "<=" ) )
                Status = DepthNew <= Depth;
            else return 0;
        }
        else return 0;
        printf( "%s\n", Status ? "succeeded" : "failed" );
        return 1;
    }
    return 0;
}